

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes2ts_main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  undefined1 local_e8 [8];
  VpxPes2Ts converter;
  string local_70 [8];
  string output_path;
  allocator local_39;
  string local_38 [8];
  string input_path;
  char **argv_local;
  int argc_local;
  
  if (argc < 3) {
    anon_unknown.dwarf_3059::Usage(argv);
    argv_local._4_4_ = 1;
  }
  else {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar1,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    pcVar1 = argv[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_70,pcVar1,
               (allocator *)
               ((long)&converter.ts_buffer_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&converter.ts_buffer_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    libwebm::VpxPes2Ts::VpxPes2Ts((VpxPes2Ts *)local_e8,(string *)local_38,(string *)local_70);
    bVar2 = libwebm::VpxPes2Ts::ConvertToFile((VpxPes2Ts *)local_e8);
    argv_local._4_4_ = (uint)!bVar2;
    libwebm::VpxPes2Ts::~VpxPes2Ts((VpxPes2Ts *)local_e8);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_38);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char* argv[]) {
  if (argc < 3) {
    Usage(argv);
    return EXIT_FAILURE;
  }

  const std::string input_path = argv[1];
  const std::string output_path = argv[2];

  libwebm::VpxPes2Ts converter(input_path, output_path);
  return converter.ConvertToFile() == true ? EXIT_SUCCESS : EXIT_FAILURE;
}